

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemTest.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_286a9::FileSystemTest_testRecursiveRemoval_Test::
~FileSystemTest_testRecursiveRemoval_Test(FileSystemTest_testRecursiveRemoval_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(FileSystemTest, testRecursiveRemoval) {
  TmpDir rootTempDir(__func__);

  SmallString<256> tempDir { rootTempDir.str() };
  llvm::sys::path::append(tempDir, "root");
  sys::mkdir(tempDir.c_str());

  SmallString<256> file{ tempDir.str() };
  llvm::sys::path::append(file, "test.txt");
  {
    std::error_code ec;
    llvm::raw_fd_ostream os(file.str(), ec, llvm::sys::fs::F_Text);
    EXPECT_FALSE(ec);
    os << "Hello, world!";
    os.close();
  }

  SmallString<256> dir{ tempDir.str() };
  llvm::sys::path::append(dir, "subdir");
  sys::mkdir(dir.c_str());

  llvm::sys::path::append(dir, "file_in_subdir.txt");
  {
    std::error_code ec;
    llvm::raw_fd_ostream os(dir.str(), ec, llvm::sys::fs::F_Text);
    EXPECT_FALSE(ec);
    os << "Hello, world!";
    os.close();
  }

  auto fs = createLocalFileSystem();
  bool result = fs->remove(tempDir.c_str());
  EXPECT_TRUE(result);

  sys::StatStruct statbuf;
  EXPECT_EQ(-1, sys::stat(tempDir.c_str(), &statbuf));
  EXPECT_EQ(ENOENT, errno);
}